

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O2

void Delete2DArray<double>(double **temp)

{
  if (temp != (double **)0x0) {
    if (*temp != (double *)0x0) {
      operator_delete__(*temp);
    }
    operator_delete__(temp);
    return;
  }
  return;
}

Assistant:

inline void Delete2DArray	(T **temp)
{
	if (temp)
    {
		if (*temp)
			delete [] * temp;
		delete [] temp;
    }
}